

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O0

void __thiscall xray_re::xr_bone::~xr_bone(xr_bone *this)

{
  xr_bone *this_local;
  
  this->_vptr_xr_bone = (_func_int **)&PTR__xr_bone_0038e440;
  std::__cxx11::string::~string((string *)&this->m_gamemtl);
  std::__cxx11::string::~string((string *)&this->m_vmap_name);
  std::__cxx11::string::~string((string *)&this->m_parent_name);
  std::__cxx11::string::~string((string *)&this->m_name);
  std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::~vector(&this->m_children);
  return;
}

Assistant:

void xr_bone::load_1(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(BONE_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == BONE_VERSION_1 || version == BONE_VERSION);

	if (!r.find_chunk(BONE_CHUNK_DEF))
		xr_not_expected();
	r.r_sz(m_name);
	r.r_sz(m_parent_name);
	r.r_sz(m_vmap_name);
	r.debug_find_chunk();

	if (!r.find_chunk(BONE_CHUNK_BIND_POSE))
		xr_not_expected();
	r.r_fvector3(m_bind_offset);
	r.r_fvector3(m_bind_rotate);
	m_bind_length = r.r_float();
	r.debug_find_chunk();
	if (version == BONE_VERSION_1)
		std::swap(m_bind_offset.x, m_bind_offset.y);

	load_data(r);
}